

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<vec<IntVar_*>_>::growTo(vec<vec<IntVar_*>_> *this,uint size)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  if (*(uint *)this < size) {
    reserve(this,size);
    uVar2 = (ulong)*(uint *)this;
    lVar3 = uVar2 << 4;
    for (; uVar2 < size; uVar2 = uVar2 + 1) {
      lVar1 = *(long *)(this + 8);
      *(undefined8 *)(lVar1 + lVar3) = 0;
      ((undefined8 *)(lVar1 + lVar3))[1] = 0;
      lVar3 = lVar3 + 0x10;
    }
    *(uint *)this = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}